

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoTableInit(Thread *this,Instr instr,Ptr *out_trap)

{
  pointer pEVar1;
  Result RVar2;
  RunResult RVar3;
  Store *pSVar4;
  Value VVar5;
  Value VVar6;
  Value VVar7;
  RefPtr<wabt::interp::Table> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  pSVar4 = this->store_;
  RefPtr<wabt::interp::Table>::RefPtr
            (&local_80,pSVar4,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  pEVar1 = (this->inst_->elems_).
           super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  VVar5 = Pop(this);
  VVar6 = Pop(this);
  VVar7 = Pop(this);
  RVar2 = Table::Init(local_80.obj_,pSVar4,VVar7.i32_,pEVar1 + instr.field_2.imm_u32x2.snd,
                      VVar6.i32_,VVar5.i32_);
  RVar3 = Ok;
  if (RVar2.enum_ == Error) {
    pSVar4 = this->store_;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"out of bounds table access: table.init out of bounds","");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,pSVar4,pSVar4,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    RVar3 = Trap;
  }
  if (local_80.obj_ != (Table *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_80.store_)->roots_,local_80.root_index_);
  }
  return RVar3;
}

Assistant:

RunResult Thread::DoTableInit(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32x2.fst]};
  auto&& elem = inst_->elems()[instr.imm_u32x2.snd];
  auto size = Pop<u32>();
  auto src = Pop<u32>();
  auto dst = Pop<u32>();
  TRAP_IF(Failed(table->Init(store_, dst, elem, src, size)),
          "out of bounds table access: table.init out of bounds");
  return RunResult::Ok;
}